

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple.hpp
# Opt level: O0

int8_t * __thiscall
burst::dynamic_tuple::set_up_creation_place<char>(dynamic_tuple *this,char *object)

{
  size_t sVar1;
  int8_t *proposed_creation_place;
  char *object_local;
  dynamic_tuple *this_local;
  
  this_local = (dynamic_tuple *)try_to_align<char>(this,object);
  if (this_local == (dynamic_tuple *)0x0) {
    sVar1 = volume(this);
    reserve(this,sVar1 + 2);
    this_local = (dynamic_tuple *)force_align<char>(this,object);
  }
  return (int8_t *)this_local;
}

Assistant:

std::int8_t * set_up_creation_place (const T & object)
        {
            if (auto proposed_creation_place = try_to_align(object))
            {
                return proposed_creation_place;
            }
            else
            {
                reserve(volume() + sizeof(T) + alignof(T));
                return force_align(object);
            }
        }